

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

double __thiscall nnad::Matrix<double>::Determinant(Matrix<double> *this)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int local_6c;
  double local_68;
  int local_5c;
  double local_58;
  Matrix<double> Cofactor;
  
  iVar1 = this->_Lines;
  if (iVar1 != this->_Columns) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&Cofactor,"Determinant: matrix must be square.",
               (allocator<char> *)&local_6c);
    Error((string *)&Cofactor);
    std::__cxx11::string::~string((string *)&Cofactor);
    iVar1 = this->_Lines;
  }
  if (iVar1 == 1) {
    Cofactor._Lines = 0;
    local_6c = 0;
    local_68 = GetElement(this,&Cofactor._Lines,&local_6c);
  }
  else {
    iVar2 = 1;
    local_68 = 0.0;
    for (local_6c = 0; local_6c < iVar1; local_6c = local_6c + 1) {
      GetCofactor(&Cofactor,this,0,local_6c);
      local_5c = 0;
      local_58 = GetElement(this,&local_5c,&local_6c);
      dVar3 = Determinant(&Cofactor);
      local_68 = local_68 + local_58 * (double)iVar2 * dVar3;
      iVar2 = -iVar2;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&Cofactor._Matrix.super__Vector_base<double,_std::allocator<double>_>);
      iVar1 = this->_Lines;
    }
  }
  return local_68;
}

Assistant:

T Determinant()
    {
      if (_Lines != _Columns)
        Error("Determinant: matrix must be square.");

      T D = 0; // Initialize result

      //  Base case : if matrix contains single element
      if (_Lines == 1)
        return this->GetElement(0,0);

      // To store sign multiplier
      int sign = 1;

      // Iterate for each element of first row
      for (int f = 0; f < _Lines; f++)
        {
          // Getting Cofactor
          Matrix<T> Cofactor = this->GetCofactor(0, f);
          D += sign * this->GetElement(0, f) * Cofactor.Determinant();

          // terms are to be added with alternate sign
          sign = -sign;
        }
      return D;
    }